

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derTSIZEEnc(octet *der,u32 tag,size_t val)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RDI;
  size_t pos;
  size_t v;
  size_t l_count;
  size_t t_count;
  size_t len;
  undefined8 local_50;
  undefined8 local_48;
  octet *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  local_28 = 1;
  local_20 = CONCAT71(in_register_00000011,in_DL);
  for (uVar1 = local_20; 0xff < uVar1; uVar1 = uVar1 >> 8) {
    local_28 = local_28 + 1;
  }
  local_8 = (uVar1 >> 7) + local_28;
  sVar2 = derTEnc(in_stack_ffffffffffffffc8,0);
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_RDI == 0) {
      local_50 = (octet *)0x0;
    }
    else {
      local_50 = (octet *)(in_RDI + sVar2);
    }
    sVar3 = derLEnc(local_50,local_8);
    if (sVar3 == 0xffffffffffffffff) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      if (in_RDI != 0) {
        local_48 = local_8;
        while (local_48 != 0) {
          *(char *)(sVar2 + sVar3 + in_RDI + (local_48 - 1)) = (char)local_20;
          local_20 = local_20 >> 8;
          local_48 = local_48 - 1;
        }
      }
      local_8 = sVar2 + sVar3 + local_8;
    }
  }
  return local_8;
}

Assistant:

size_t derTSIZEEnc(octet der[], u32 tag, size_t val)
{
	size_t len = 1;
	size_t t_count;
	size_t l_count;
	// определить длину V
	{
		register size_t v = val;
		for (; v >= 256; v >>= 8, ++len);
		len += v >> 7, v = 0;
	}
	// кодировать T
	t_count = derTEnc(der, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(der ? der + t_count : 0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать V
	if (der)
	{
		size_t pos = len;
		der += t_count + l_count;
		ASSERT(memIsValid(der, len));
		for (; pos--; val >>= 8)
			der[pos] = (octet)val;
	}
	return t_count + l_count + len;
}